

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O1

RK_S32 mpp_av1_read_tx_mode(AV1Context *ctx,BitReadCtx_t *gb,AV1RawFrameHeader *current)

{
  RK_S32 RVar1;
  undefined8 in_RAX;
  RK_U32 value;
  RK_U8 local_14 [4];
  
  local_14[0] = (RK_U8)((ulong)in_RAX >> 0x20);
  if (ctx->coded_lossless == 0) {
    RVar1 = mpp_av1_read_unsigned(gb,1,"tx_mode",(RK_U32 *)local_14,0,1);
    if (-1 < RVar1) {
      current->tx_mode = local_14[0];
      current->tx_mode = '\x02' - (local_14[0] == '\0');
      RVar1 = 0;
    }
  }
  else {
    current->tx_mode = '\0';
    RVar1 = 0;
  }
  return RVar1;
}

Assistant:

static RK_S32 mpp_av1_read_tx_mode(AV1Context *ctx, BitReadCtx_t *gb,
                                   AV1RawFrameHeader *current)
{
    RK_S32 err;

    if (ctx->coded_lossless)
        infer(tx_mode, 0);
    else {
        flag(tx_mode);
        current->tx_mode = current->tx_mode ? TX_MODE_SELECT : TX_MODE_LARGEST;
    }

    return 0;
}